

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool __thiscall argo::json::operator_cast_to_bool(json *this)

{
  json_exception *this_00;
  char *json_type_name;
  undefined1 uVar1;
  
  if (this->m_type == number_int_e) {
    uVar1 = (this->m_value).u_number_int != 0;
  }
  else {
    if (this->m_type != boolean_e) {
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_type_name = get_instance_type_name(this);
      json_exception::json_exception(this_00,not_number_int_or_boolean_e,json_type_name);
      __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
    }
    uVar1 = (this->m_value).u_boolean;
  }
  return (bool)uVar1;
}

Assistant:

json::operator bool() const
{
    if (m_type == boolean_e)
    {
        return m_value.u_boolean;
    }
    else if (m_type == number_int_e)
    {
        return m_value.u_number_int != 0;
    }
    else
    {
        throw json_exception(json_exception::not_number_int_or_boolean_e, get_instance_type_name());
    }
}